

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlancedBinaryTree.c
# Opt level: O3

int SearchBBT(BiTree T,int key,BiTree m,BiTree *p)

{
  int iVar1;
  
  iVar1 = 0;
  do {
    if (T == (BiTree)0x0) {
LAB_001013a8:
      *p = m;
      return iVar1;
    }
    m = T;
    if (T->data == key) {
      iVar1 = 1;
      goto LAB_001013a8;
    }
    T = (&T->lchild)[T->data <= key];
  } while( true );
}

Assistant:

int SearchBBT(BiTree T,int key,BiTree m,BiTree *p){
    if(!T){             //查找失败
        *p = m;
        return 0;
    }
    else if (key == T->data){   //找到key
        *p = T;
        return 1;
    }
    else if(key < T->data){
        return SearchBBT(T->lchild,key,T,p);
    }
    else {
        return SearchBBT(T->rchlid,key,T,p);
    }
}